

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_construct_destruct_withAllocator_invalid_fn(int _i)

{
  int line;
  void *pvVar1;
  
  private_ACUtilsTest_ADynArray_freeCount = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  pvVar1 = private_ACUtils_ADynArray_constructWithAllocator
                     (1,(ACUtilsReallocator)0x0,private_ACUtilsTest_ADynArray_free);
  if (pvVar1 == (void *)0x0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x4f);
    pvVar1 = private_ACUtils_ADynArray_constructWithAllocator
                       (1,private_ACUtilsTest_ADynArray_realloc,(ACUtilsDeallocator)0x0);
    if (pvVar1 == (void *)0x0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x51);
      return;
    }
    line = 0x51;
  }
  else {
    line = 0x4f;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,"Assertion \'_ck_x == NULL\' failed","Assertion \'%s\' failed: %s == %#x",
                    "(void*) array == NULL","(void*) array",pvVar1,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_construct_destruct_withAllocator_invalid)
{
    struct private_ACUtilsTest_ADynArray_CharArray *array;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = private_ACUtilsTest_ADynArray_freeCount = 0;
    array = ADynArray_constructWithAllocator(struct private_ACUtilsTest_ADynArray_CharArray, nullptr, private_ACUtilsTest_ADynArray_free);
    ACUTILSTEST_ASSERT_PTR_NULL(array);
    array = ADynArray_constructWithAllocator(struct private_ACUtilsTest_ADynArray_CharArray, private_ACUtilsTest_ADynArray_realloc, nullptr);
    ACUTILSTEST_ASSERT_PTR_NULL(array);
}